

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrypt.cc
# Opt level: O0

void scryptBlockMix(block_t *out,block_t *B,uint64_t r)

{
  ulong local_68;
  uint64_t i;
  block_t X;
  uint64_t r_local;
  block_t *B_local;
  block_t *out_local;
  
  X.words._56_8_ = r;
  if (out != B) {
    OPENSSL_memcpy(&i,B + r * 2 + -1,0x40);
    for (local_68 = 0; local_68 < (ulong)(X.words._56_8_ << 1); local_68 = local_68 + 1) {
      xor_block((block_t *)&i,(block_t *)&i,B + local_68);
      salsa208_word_specification((block_t *)&i);
      OPENSSL_memcpy(out + (local_68 >> 1) + (local_68 & 1) * X.words._56_8_,&i,0x40);
    }
    return;
  }
  __assert_fail("out != B",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/scrypt.cc"
                ,99,"void scryptBlockMix(block_t *, const block_t *, uint64_t)");
}

Assistant:

static void scryptBlockMix(block_t *out, const block_t *B, uint64_t r) {
  assert(out != B);

  block_t X;
  OPENSSL_memcpy(&X, &B[r * 2 - 1], sizeof(X));
  for (uint64_t i = 0; i < r * 2; i++) {
    xor_block(&X, &X, &B[i]);
    salsa208_word_specification(&X);

    // This implements the permutation in step 3.
    OPENSSL_memcpy(&out[i / 2 + (i & 1) * r], &X, sizeof(X));
  }
}